

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QJsonArray convertToJsonArray(QCborContainerPrivate *d,ConversionMode mode)

{
  long lVar1;
  qsizetype qVar2;
  ConversionMode in_EDX;
  long in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  qsizetype idx;
  QJsonArray *a;
  QJsonValue *value;
  QExplicitlySharedDataPointer<QCborContainerPrivate> this;
  QJsonValue *local_40;
  QExplicitlySharedDataPointer<QCborContainerPrivate> d_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  this.d.ptr = in_RDI.d.ptr;
  d_00.d.ptr = in_RDI.d.ptr;
  QJsonArray::QJsonArray((QJsonArray *)0x488dd1);
  if (in_RSI != 0) {
    local_40 = (QJsonValue *)0x0;
    while (value = local_40,
          qVar2 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(in_RSI + 0x28)),
          (long)value < qVar2) {
      qt_convertToJson((QCborContainerPrivate *)d_00.d.ptr,in_RSI,in_EDX);
      QJsonArray::append((QJsonArray *)this.d.ptr,value);
      QJsonValue::~QJsonValue((QJsonValue *)0x488e40);
      local_40 = (QJsonValue *)((long)&(local_40->value).n + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonArray convertToJsonArray(QCborContainerPrivate *d,
                                     ConversionMode mode = ConversionMode::FromRaw)
{
    QJsonArray a;
    if (d) {
        for (qsizetype idx = 0; idx < d->elements.size(); ++idx)
            a.append(qt_convertToJson(d, idx, mode));
    }
    return a;
}